

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt_limits.c
# Opt level: O0

uchar * cliff(size_t *size)

{
  size_t sVar1;
  int iVar2;
  uchar *puVar3;
  uint *puVar4;
  uchar *p;
  size_t *size_local;
  
  iVar2 = getpagesize();
  *size = (long)iVar2;
  sVar1 = *size;
  iVar2 = getpagesize();
  puVar3 = (uchar *)mmap((void *)0x0,sVar1 + (long)iVar2,3,0x22,-1,0);
  if (puVar3 == (uchar *)0xffffffffffffffff) {
    puVar4 = (uint *)__errno_location();
    fail("Failed to mmap anon, errno %d",(ulong)*puVar4);
  }
  sVar1 = *size;
  iVar2 = getpagesize();
  iVar2 = munmap(puVar3 + sVar1,(long)iVar2);
  if (iVar2 != 0) {
    puVar4 = (uint *)__errno_location();
    fail("Failed to munmap /dev/zero, errno %d",(ulong)*puVar4);
  }
  return puVar3;
}

Assistant:

static unsigned char *cliff(size_t *size)
{
    unsigned char *p;

#ifdef _WIN32
    SYSTEM_INFO info;
    DWORD tmp;

    GetSystemInfo(&info);
    *size = info.dwPageSize;

    p = (unsigned char *)VirtualAlloc(NULL, (*size) * 2, MEM_RESERVE | MEM_COMMIT, PAGE_READWRITE);
    if (!p)
        fail("VirtualAlloc failed, err %d", GetLastError());

    if (!VirtualProtect(p + *size, *size, PAGE_READWRITE | PAGE_GUARD, &tmp))
        fail("VirtualProtect failed, err %d", GetLastError());
#else
    /* One page is enough for our tests so far */
    *size = getpagesize();

    /* MAP_ANON isn't POSIX, but MacOS doesn't let us mmap /dev/zero */
    p = mmap(NULL, *size + getpagesize(),
             PROT_READ | PROT_WRITE, MAP_ANON | MAP_PRIVATE, -1, 0);
    if (p == MAP_FAILED)
        fail("Failed to mmap anon, errno %d", errno);

    /* Remove second page. */
    if (munmap(p + *size, getpagesize()) != 0)
        fail("Failed to munmap /dev/zero, errno %d", errno);
#endif
    return p;
}